

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O3

string * __thiscall
elf_parser::Elf_parser::get_symbol_index_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint16_t *sym_idx)

{
  ushort uVar1;
  char *pcVar2;
  string *__str;
  uint __val;
  char *pcVar3;
  uint __len;
  
  uVar1 = *sym_idx;
  __val = (uint)uVar1;
  if (uVar1 < 0xfff2) {
    if (__val == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "UND";
      pcVar2 = "";
    }
    else {
      if (uVar1 != 0xfff1) goto LAB_0011455b;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "ABS";
      pcVar2 = "";
    }
  }
  else {
    if ((uVar1 != 0xfff2) && (__val != 0xffff)) {
LAB_0011455b:
      __len = 1;
      if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < uVar1)) {
        __len = 5 - (uVar1 < 10000);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((__return_storage_ptr__->_M_dataplus)._M_p,__len,__val);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "COM";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_symbol_index(uint16_t &sym_idx) {
    switch(sym_idx) {
        case SHN_ABS: return "ABS";
        case SHN_COMMON: return "COM";
        case SHN_UNDEF: return "UND";
        case SHN_XINDEX: return "COM";
        default: return std::to_string(sym_idx);
    }
}